

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

void CanonicalizePath(char *path,size_t *len,uint64_t *slash_bits)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  char *components [60];
  undefined8 local_1e8 [60];
  
  sVar4 = *len;
  if (sVar4 != 0) {
    pcVar6 = path + (*path == '/');
    if ((long)(ulong)(*path == '/') < (long)sVar4) {
      pcVar5 = path + sVar4;
      uVar9 = 0;
      pcVar7 = pcVar6;
      do {
        lVar10 = 1;
        if (*pcVar7 == '/') {
LAB_00120ec5:
          pcVar7 = pcVar7 + lVar10;
        }
        else {
          iVar8 = (int)uVar9;
          if (*pcVar7 == '.') {
            pcVar1 = pcVar7 + 1;
            lVar10 = 2;
            if ((pcVar1 == pcVar5) || (*pcVar1 == '/')) goto LAB_00120ec5;
            if ((*pcVar1 != '.') || ((pcVar2 = pcVar7 + 2, pcVar2 != pcVar5 && (*pcVar2 != '/'))))
            goto LAB_00120ef1;
            if (iVar8 < 1) {
              *pcVar6 = '.';
              pcVar6[1] = *pcVar1;
              pcVar6[2] = *pcVar2;
              pcVar6 = pcVar6 + 3;
            }
            else {
              uVar9 = (ulong)(iVar8 - 1);
              pcVar6 = (char *)local_1e8[uVar9];
            }
            pcVar7 = pcVar7 + 3;
          }
          else {
LAB_00120ef1:
            if (iVar8 == 0x3c) {
              Fatal("path has too many components : %s",path);
            }
            local_1e8[iVar8] = pcVar6;
            for (; (pcVar7 != pcVar5 && (*pcVar7 != '/')); pcVar7 = pcVar7 + 1) {
              *pcVar6 = *pcVar7;
              pcVar6 = pcVar6 + 1;
            }
            uVar9 = (ulong)(iVar8 + 1);
            cVar3 = *pcVar7;
            pcVar7 = pcVar7 + 1;
            *pcVar6 = cVar3;
            pcVar6 = pcVar6 + 1;
          }
        }
      } while (pcVar7 < pcVar5);
    }
    if (pcVar6 == path) {
      pcVar6[0] = '.';
      pcVar6[1] = '\0';
      pcVar6 = pcVar6 + 2;
    }
    *len = (size_t)(pcVar6 + ~(ulong)path);
    *slash_bits = 0;
  }
  return;
}

Assistant:

void CanonicalizePath(char* path, size_t* len, uint64_t* slash_bits) {
  // WARNING: this function is performance-critical; please benchmark
  // any changes you make to it.
  if (*len == 0) {
    return;
  }

  const int kMaxPathComponents = 60;
  char* components[kMaxPathComponents];
  int component_count = 0;

  char* start = path;
  char* dst = start;
  const char* src = start;
  const char* end = start + *len;

  if (IsPathSeparator(*src)) {
#ifdef _WIN32

    // network path starts with //
    if (*len > 1 && IsPathSeparator(*(src + 1))) {
      src += 2;
      dst += 2;
    } else {
      ++src;
      ++dst;
    }
#else
    ++src;
    ++dst;
#endif
  }

  while (src < end) {
    if (*src == '.') {
      if (src + 1 == end || IsPathSeparator(src[1])) {
        // '.' component; eliminate.
        src += 2;
        continue;
      } else if (src[1] == '.' && (src + 2 == end || IsPathSeparator(src[2]))) {
        // '..' component.  Back up if possible.
        if (component_count > 0) {
          dst = components[component_count - 1];
          src += 3;
          --component_count;
        } else {
          *dst++ = *src++;
          *dst++ = *src++;
          *dst++ = *src++;
        }
        continue;
      }
    }

    if (IsPathSeparator(*src)) {
      src++;
      continue;
    }

    if (component_count == kMaxPathComponents)
      Fatal("path has too many components : %s", path);
    components[component_count] = dst;
    ++component_count;

    while (src != end && !IsPathSeparator(*src))
      *dst++ = *src++;
    *dst++ = *src++;  // Copy '/' or final \0 character as well.
  }

  if (dst == start) {
    *dst++ = '.';
    *dst++ = '\0';
  }

  *len = dst - start - 1;
#ifdef _WIN32
  uint64_t bits = 0;
  uint64_t bits_mask = 1;

  for (char* c = start; c < start + *len; ++c) {
    switch (*c) {
      case '\\':
        bits |= bits_mask;
        *c = '/';
        NINJA_FALLTHROUGH;
      case '/':
        bits_mask <<= 1;
    }
  }

  *slash_bits = bits;
#else
  *slash_bits = 0;
#endif
}